

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O3

QString * SectionHdrWrapper::getSecHdrAccessRightsDesc
                    (QString *__return_storage_ptr__,DWORD characteristics)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  char rights [4];
  undefined4 local_3c;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  local_3c = 0x2d2d2d;
  if ((characteristics >> 0x1e & 1) != 0) {
    local_3c = 0x2d2d72;
  }
  if ((int)characteristics < 0) {
    local_3c._0_2_ = CONCAT11(0x77,(char)local_3c);
  }
  if ((characteristics >> 0x1d & 1) != 0) {
    local_3c = (uint)CONCAT12(0x78,(undefined2)local_3c);
  }
  psVar1 = (storage_type *)strlen((char *)&local_3c);
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_38;
  (__return_storage_ptr__->d).ptr = pcStack_30;
  (__return_storage_ptr__->d).size = local_28;
  return __return_storage_ptr__;
}

Assistant:

QString SectionHdrWrapper::getSecHdrAccessRightsDesc(DWORD characteristics)
{
    char rights[] = "---";

    if (characteristics & SCN_MEM_READ)
        rights[0] = 'r';
    if (characteristics & SCN_MEM_WRITE)
        rights[1] = 'w';
    if (characteristics & SCN_MEM_EXECUTE)
        rights[2] = 'x';
    return rights;
}